

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
ADPlanner::GetSearchPath
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ADPlanner *this,
          ADSearchStateSpace_t *pSearchStateSpace,int *solcost)

{
  int iVar1;
  iterator iVar2;
  DiscreteSpaceInformation *pDVar3;
  uint *__args;
  pointer piVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  runtime_error *prVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  void *pvVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  CMDPSTATE *__args_00;
  CMDPSTATE *pCVar16;
  uint uVar17;
  vector<int,_std::allocator<int>_> CostV;
  vector<int,_std::allocator<int>_> SuccIDV;
  void *local_68;
  long lStack_60;
  long local_58;
  void *local_48;
  long lStack_40;
  long local_38;
  
  local_38 = 0;
  local_48 = (void *)0x0;
  lStack_40 = 0;
  local_58 = 0;
  local_68 = (void *)0x0;
  lStack_60 = 0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->bforwardsearch == true) {
    pCVar16 = pSearchStateSpace->searchgoalstate;
    __args_00 = pSearchStateSpace->searchstartstate;
    iVar6 = (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x30])(this,pSearchStateSpace);
    if (iVar6 == 1) goto LAB_00135652;
  }
  else {
    __args_00 = pSearchStateSpace->searchgoalstate;
    pCVar16 = pSearchStateSpace->searchstartstate;
LAB_00135652:
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar2,&__args_00->StateID
                );
    }
    else {
      *iVar2._M_current = __args_00->StateID;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    *solcost = 0;
    if (_stdout == 0) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"ERROR: could not open file");
      *(undefined ***)prVar8 = &PTR__runtime_error_001574d0;
      __cxa_throw(prVar8,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar13 = (ulong)(uint)__args_00->StateID;
    uVar7 = pCVar16->StateID;
    if ((__args_00->StateID != uVar7) &&
       (pvVar12 = __args_00->PlannerSpecificData, pvVar12 != (void *)0x0)) {
      uVar5 = 1;
      uVar17 = 0;
      while ((uVar9 = uVar5, *(long *)((long)pvVar12 + 0x38) != 0 &&
             (*(int *)((long)pvVar12 + 0x24) != 1000000000))) {
        pDVar3 = (this->super_SBPLPlanner).environment_;
        (*pDVar3->_vptr_DiscreteSpaceInformation[5])(pDVar3,uVar13,&local_48,&local_68);
        uVar13 = lStack_40 - (long)local_48 >> 2;
        if ((int)(uint)uVar13 < 1) {
          iVar6 = 1000000000;
        }
        else {
          uVar10 = lStack_60 - (long)local_68 >> 2;
          iVar6 = 1000000000;
          uVar15 = 0;
          do {
            uVar11 = uVar13;
            uVar14 = uVar13;
            if (uVar13 == uVar15) {
LAB_00135821:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar14,uVar11);
            }
            if (*(int *)((long)local_48 + uVar15 * 4) == **(int **)((long)pvVar12 + 0x38)) {
              uVar11 = uVar10;
              uVar14 = uVar15;
              if (uVar10 <= uVar15) goto LAB_00135821;
              iVar1 = *(int *)((long)local_68 + uVar15 * 4);
              if (iVar1 < iVar6) {
                iVar6 = iVar1;
              }
            }
            uVar15 = uVar15 + 1;
          } while (((uint)uVar13 & 0x7fffffff) != uVar15);
        }
        *solcost = *solcost + iVar6;
        if (*(uint *)((long)pvVar12 + 0x20) < *(uint *)((long)pvVar12 + 0x24)) {
          (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x31])(this,pvVar12,_stdout);
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar8,"ERROR: underconsistent state on the path");
          *(undefined ***)prVar8 = &PTR__runtime_error_001574d0;
          __cxa_throw(prVar8,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
        }
        __args = *(uint **)((long)pvVar12 + 0x38);
        iVar2._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar2,(int *)__args);
        }
        else {
          *iVar2._M_current = *__args;
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        uVar13 = (ulong)*__args;
        uVar7 = pCVar16->StateID;
        if ((*__args == uVar7) || (0x1869e < uVar17)) break;
        pvVar12 = *(void **)(__args + 0xe);
        uVar5 = uVar9 + 1;
        uVar17 = uVar9;
        if (pvVar12 == (void *)0x0) break;
      }
    }
    if ((uint)uVar13 == uVar7) goto LAB_001357d9;
    piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish != piVar4) {
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish = piVar4;
    }
  }
  *solcost = 1000000000;
LAB_001357d9:
  if (local_68 != (void *)0x0) {
    operator_delete(local_68,local_58 - (long)local_68);
  }
  if (local_48 != (void *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> ADPlanner::GetSearchPath(ADSearchStateSpace_t* pSearchStateSpace, int& solcost)
{
    vector<int> SuccIDV;
    vector<int> CostV;
    vector<int> wholePathIds;
    ADState* searchstateinfo;
    CMDPSTATE* state = NULL;
    CMDPSTATE* goalstate = NULL;
    CMDPSTATE* startstate = NULL;

    if (bforwardsearch) {
        startstate = pSearchStateSpace->searchstartstate;
        goalstate = pSearchStateSpace->searchgoalstate;

        //reconstruct the path by setting bestnextstate pointers appropriately
        if (ReconstructPath(pSearchStateSpace) != 1) {
            solcost = INFINITECOST;
            return wholePathIds;
        }
    }
    else {
        startstate = pSearchStateSpace->searchgoalstate;
        goalstate = pSearchStateSpace->searchstartstate;
    }

#if DEBUG
    //PrintSearchPath(pSearchStateSpace, fDeb);
#endif

    state = startstate;

    wholePathIds.push_back(state->StateID);
    solcost = 0;

    FILE* fOut = stdout;
    if (fOut == NULL) {
        throw SBPL_Exception("ERROR: could not open file");
    }
    int steps = 0;
    const int max_steps = 100000;
    while (state->StateID != goalstate->StateID && steps < max_steps) {
        steps++;

        if (state->PlannerSpecificData == NULL) {
            SBPL_FPRINTF(fOut, "path does not exist since search data does not exist\n");
            break;
        }

        searchstateinfo = (ADState*)state->PlannerSpecificData;

        if (searchstateinfo->bestnextstate == NULL) {
            SBPL_FPRINTF(fOut, "path does not exist since bestnextstate == NULL\n");
            break;
        }
        if (searchstateinfo->g == INFINITECOST) {
            SBPL_FPRINTF(fOut, "path does not exist since bestnextstate == NULL\n");
            break;
        }

        environment_->GetSuccs(state->StateID, &SuccIDV, &CostV);
        int actioncost = INFINITECOST;
        for (int i = 0; i < (int)SuccIDV.size(); i++) {
            if (SuccIDV.at(i) == searchstateinfo->bestnextstate->StateID && CostV.at(i) < actioncost) actioncost
                = CostV.at(i);

        }
        solcost += actioncost;

        if (searchstateinfo->v < searchstateinfo->g) {
            const char* msg = "ERROR: underconsistent state on the path";
            SBPL_ERROR("%s\n", msg);
            PrintSearchState(searchstateinfo, stdout);
            //SBPL_FPRINTF(fDeb, "ERROR: underconsistent state on the path\n");
            //PrintSearchState(searchstateinfo, fDeb);
            throw SBPL_Exception(msg);
        }

        //SBPL_FPRINTF(fDeb, "actioncost=%d between states %d and %d\n",
        //        actioncost, state->StateID, searchstateinfo->bestnextstate->StateID);
        //environment_->PrintState(state->StateID, false, fDeb);
        //environment_->PrintState(searchstateinfo->bestnextstate->StateID, false, fDeb);

        state = searchstateinfo->bestnextstate;

        wholePathIds.push_back(state->StateID);
    }

    if (state->StateID != goalstate->StateID) {
        SBPL_ERROR("ERROR: Failed to getsearchpath, steps processed=%d\n", steps);
        wholePathIds.clear();
        solcost = INFINITECOST;
        return wholePathIds;
    }

    //PrintSearchPath(pSearchStateSpace, stdout);

    return wholePathIds;
}